

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_1_class_declare(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  G->val[-3] = (PVIPNode *)0x0;
  G->val[-2] = (PVIPNode *)0x0;
  return;
}

Assistant:

YY_ACTION(void) yy_1_class_declare(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define is G->val[-2]
#define i G->val[-3]
  yyprintf((stderr, "do yy_1_class_declare"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {i=NULL; is=NULL; }\n"));
  i=NULL; is=NULL; ;
#undef b
#undef is
#undef i
}